

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx2::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  uint uVar10;
  BVH *bvh;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  byte bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [12];
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  GridSOA *pGVar44;
  vint<4> vVar45;
  bool bVar46;
  uint uVar47;
  int iVar48;
  AABBNodeMB4D *node1;
  ulong uVar49;
  GridSOA *pGVar50;
  undefined8 uVar51;
  size_t sVar52;
  undefined4 uVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  Primitive_conflict3 *prim;
  NodeRef root;
  ulong uVar57;
  long lVar58;
  long lVar59;
  NodeRef *pNVar60;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar61;
  long lVar62;
  ulong uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar80;
  undefined1 in_ZMM0 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  vint4 ai;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  vint4 ai_1;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  vint4 ai_3;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  vint4 bi;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  vint4 ai_2;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  vint4 bi_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  vint4 bi_3;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar207;
  float fVar211;
  float fVar212;
  vint4 bi_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar213;
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 local_1ca8 [16];
  undefined1 local_1c98 [8];
  float fStack_1c90;
  undefined4 uStack_1c8c;
  undefined1 local_1c88 [16];
  undefined1 local_1c28 [16];
  ulong local_1c18;
  RayK<4> *local_1c10;
  GridSOA *local_1c08;
  int local_1c00;
  undefined4 local_1bfc;
  undefined1 local_1bf8 [16];
  undefined1 local_1be8 [16];
  undefined1 local_1bd8 [16];
  undefined1 local_1bc8 [16];
  undefined1 local_1bb8 [16];
  vbool<4> terminated;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined1 local_1b28 [8];
  float fStack_1b20;
  float fStack_1b1c;
  float local_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  vint<4> vitime;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined1 local_19e8 [16];
  undefined1 local_19d8 [16];
  undefined1 local_19c8 [16];
  undefined1 local_19b8 [16];
  uint local_19a8;
  uint uStack_19a4;
  uint uStack_19a0;
  uint uStack_199c;
  uint uStack_1998;
  uint uStack_1994;
  uint uStack_1990;
  uint uStack_198c;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined1 local_1978 [16];
  longlong local_1968;
  longlong lStack_1960;
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  undefined1 local_1938 [16];
  undefined1 local_1928 [16];
  undefined1 local_1918 [16];
  undefined1 local_1908 [16];
  undefined1 local_18f8 [16];
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [8];
  float fStack_18d0;
  float fStack_18cc;
  undefined1 local_18c8 [8];
  float fStack_18c0;
  float fStack_18bc;
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined1 local_1868 [8];
  float fStack_1860;
  float fStack_185c;
  undefined1 local_1858 [8];
  float fStack_1850;
  float fStack_184c;
  undefined1 local_1848 [16];
  undefined1 local_1838 [16];
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar101 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar141 = vpcmpeqd_avx(auVar101,(undefined1  [16])valid_i->field_0);
    auVar73 = ZEXT816(0) << 0x40;
    auVar128 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar73,5);
    auVar96 = auVar141 & auVar128;
    if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar96[0xf] < '\0')
    {
      local_1978 = vandps_avx(auVar128,auVar141);
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar222._8_4_ = 0x7fffffff;
      auVar222._0_8_ = 0x7fffffff7fffffff;
      auVar222._12_4_ = 0x7fffffff;
      auVar128 = vandps_avx(auVar222,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar214._8_4_ = 0x219392ef;
      auVar214._0_8_ = 0x219392ef219392ef;
      auVar214._12_4_ = 0x219392ef;
      auVar128 = vcmpps_avx(auVar128,auVar214,1);
      auVar141 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar214,
                               auVar128);
      auVar128 = vandps_avx(auVar222,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar128 = vcmpps_avx(auVar128,auVar214,1);
      auVar96 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar214,auVar128
                             );
      auVar128 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar222);
      auVar128 = vcmpps_avx(auVar128,auVar214,1);
      auVar128 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar214,
                               auVar128);
      auVar153 = vrcpps_avx(auVar141);
      auVar202._8_4_ = 0x3f800000;
      auVar202._0_8_ = 0x3f8000003f800000;
      auVar202._12_4_ = 0x3f800000;
      auVar141 = vfnmadd213ps_fma(auVar141,auVar153,auVar202);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar141,auVar153,auVar153);
      auVar141 = vrcpps_avx(auVar96);
      auVar96 = vfnmadd213ps_fma(auVar96,auVar141,auVar202);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar96,auVar141,auVar141);
      auVar141 = vrcpps_avx(auVar128);
      auVar128 = vfnmadd213ps_fma(auVar128,auVar141,auVar202);
      tray.rdir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar128,auVar141,auVar141);
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar128 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar73,1);
      auVar141._8_4_ = 0x10;
      auVar141._0_8_ = 0x1000000010;
      auVar141._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar128,auVar141);
      auVar128 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar73,5);
      auVar153._8_4_ = 0x20;
      auVar153._0_8_ = 0x2000000020;
      auVar153._12_4_ = 0x20;
      auVar83._8_4_ = 0x30;
      auVar83._0_8_ = 0x3000000030;
      auVar83._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar83,auVar153,auVar128);
      auVar128 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar73,5);
      auVar74._8_4_ = 0x40;
      auVar74._0_8_ = 0x4000000040;
      auVar74._12_4_ = 0x40;
      auVar155._8_4_ = 0x50;
      auVar155._0_8_ = 0x5000000050;
      auVar155._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar155,auVar74,auVar128);
      auVar128 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar73);
      auVar141 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar73);
      auVar96._8_4_ = 0x7f800000;
      auVar96._0_8_ = 0x7f8000007f800000;
      auVar96._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar96,auVar128,local_1978)
      ;
      auVar128._8_4_ = 0xff800000;
      auVar128._0_8_ = 0xff800000ff800000;
      auVar128._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx(auVar128,auVar141,local_1978);
      terminated.field_0.i[1] = local_1978._4_4_ ^ auVar101._4_4_;
      terminated.field_0.i[0] = local_1978._0_4_ ^ auVar101._0_4_;
      terminated.field_0.i[2] = local_1978._8_4_ ^ auVar101._8_4_;
      terminated.field_0.i[3] = local_1978._12_4_ ^ auVar101._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar57 = 3;
      }
      else {
        uVar57 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1c10 = ray + 0x80;
      pNVar60 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar61 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_1988 = mm_lookupmask_ps._0_8_;
      uStack_1980 = mm_lookupmask_ps._8_8_;
      bVar22 = (byte)uVar57;
      local_1c18 = uVar57;
LAB_019c77aa:
      do {
        do {
          root.ptr = pNVar60[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_019c90a8;
          pNVar60 = pNVar60 + -1;
          paVar61 = paVar61 + -1;
          aVar81.i = *(int (*) [4])paVar61;
          auVar128 = vcmpps_avx((undefined1  [16])aVar81,(undefined1  [16])tray.tfar.field_0,1);
          uVar47 = vmovmskps_avx(auVar128);
        } while (uVar47 == 0);
        uVar63 = (ulong)(uVar47 & 0xff);
        uVar49 = (ulong)(uint)POPCOUNT(uVar47 & 0xff);
        if (uVar57 < uVar49) {
LAB_019c77eb:
          auVar127 = ZEXT1664((undefined1  [16])aVar81);
          do {
            uVar47 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_019c90a8;
              auVar128 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar127._0_16_,6);
              if ((((auVar128 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar128 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar128 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar128[0xf] < '\0') {
                if ((uVar47 & 0xf) == 8) {
                  fVar100 = (float)(*(int *)(pre.super_Precalculations.grid + 8) - 1);
                  auVar82._0_4_ = fVar100 * *(float *)(ray + 0x70);
                  auVar82._4_4_ = fVar100 * *(float *)(ray + 0x74);
                  auVar82._8_4_ = fVar100 * *(float *)(ray + 0x78);
                  auVar82._12_4_ = fVar100 * *(float *)(ray + 0x7c);
                  auVar128 = vroundps_avx(auVar82,1);
                  fVar100 = fVar100 + -1.0;
                  auVar102._4_4_ = fVar100;
                  auVar102._0_4_ = fVar100;
                  auVar102._8_4_ = fVar100;
                  auVar102._12_4_ = fVar100;
                  auVar128 = vminps_avx(auVar128,auVar102);
                  auVar128 = vmaxps_avx(auVar128,_DAT_01f7aa10);
                  vitime.field_0 =
                       (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar128);
                  vVar45.field_0 = vitime.field_0;
                  uVar47 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                  uVar47 = uVar47 ^ 0xf;
                  aVar80 = terminated.field_0;
                  if (uVar47 != 0) {
                    auVar128 = vsubps_avx(auVar82,auVar128);
                    auVar103._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                    auVar103._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                    auVar103._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                    auVar64._8_4_ = 0x3f800000;
                    auVar64._0_8_ = 0x3f8000003f800000;
                    auVar64._12_4_ = 0x3f800000;
                    auVar101 = vsubps_avx(auVar64,auVar128);
                    local_1968 = vitime.field_0.v[0];
                    lStack_1960 = vitime.field_0.v[1];
                    uVar57 = root.ptr >> 2 & 0xfffffffffffffffc;
                    auVar141 = auVar103;
                    vitime.field_0 = vVar45.field_0;
                    do {
                      pGVar44 = pre.super_Precalculations.grid;
                      local_1938 = auVar103;
                      uVar21 = 0;
                      for (uVar47 = uVar47 & 0xff; (uVar47 & 1) == 0;
                          uVar47 = uVar47 >> 1 | 0x80000000) {
                        uVar21 = uVar21 + 1;
                      }
                      iVar48 = vitime.field_0.i[uVar21];
                      auVar65._4_4_ = iVar48;
                      auVar65._0_4_ = iVar48;
                      auVar65._8_4_ = iVar48;
                      auVar65._12_4_ = iVar48;
                      auVar27._8_8_ = lStack_1960;
                      auVar27._0_8_ = local_1968;
                      auVar96 = vpcmpeqd_avx(auVar65,auVar27);
                      local_1948 = vpand_avx(auVar96,auVar141);
                      local_1958 = local_1948 ^ _DAT_01f7ae20;
                      uVar49 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
                      uVar47 = *(uint *)(pre.super_Precalculations.grid + 0xc);
                      local_1c00 = *(int *)(pre.super_Precalculations.grid + 0x10);
                      lVar55 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x28) *
                               (long)iVar48 +
                               (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24);
                      uVar63 = (ulong)(*(uint *)(pre.super_Precalculations.grid + 0x28) & 0xfffffffc
                                      );
                      lVar54 = lVar55 + uVar63;
                      lVar31 = lVar54 + uVar49 * 0xc + uVar57;
                      lVar58 = (ulong)uVar47 * 4;
                      lVar1 = lVar55 + uVar49 * 8;
                      lVar30 = uVar63 + lVar1 + uVar57;
                      lVar32 = lVar54 + uVar49 * 4 + uVar57;
                      lVar2 = lVar55 + uVar49 * 4;
                      pGVar50 = pre.super_Precalculations.grid + uVar57 + 0x2c;
                      uVar51 = CONCAT71((int7)((ulong)pGVar50 >> 8),1);
                      lVar62 = 0;
                      auVar127 = ZEXT1664(local_1948);
                      do {
                        local_1bfc = (undefined4)uVar51;
                        lVar59 = (lVar62 + 1) * lVar58;
                        lVar33 = lVar59 + lVar31;
                        lVar35 = lVar59 + lVar30;
                        lVar37 = lVar59 + lVar32;
                        lVar39 = lVar59 + lVar54 + uVar57;
                        lVar41 = lVar59 + lVar1 + uVar57 + 0x30;
                        lVar42 = lVar59 + lVar2 + uVar57 + 0x30;
                        lVar59 = lVar59 + lVar55 + uVar57;
                        lVar62 = lVar62 * lVar58;
                        lVar34 = lVar62 + lVar31;
                        lVar36 = lVar62 + lVar30;
                        lVar38 = lVar62 + lVar32;
                        lVar40 = lVar62 + lVar54 + uVar57;
                        lVar43 = lVar62 + lVar2;
                        local_1c08 = pGVar50 + lVar62 + lVar55;
                        lVar56 = 0;
                        do {
                          if ((ulong)((ulong)uVar47 != 2) * 4 + 4 == lVar56) break;
                          uVar53 = *(undefined4 *)(local_1c08 + lVar56);
                          auVar171._4_4_ = uVar53;
                          auVar171._0_4_ = uVar53;
                          auVar171._8_4_ = uVar53;
                          auVar171._12_4_ = uVar53;
                          uVar53 = *(undefined4 *)(pGVar50 + lVar56 + lVar43);
                          auVar186._4_4_ = uVar53;
                          auVar186._0_4_ = uVar53;
                          auVar186._8_4_ = uVar53;
                          auVar186._12_4_ = uVar53;
                          uVar53 = *(undefined4 *)(pGVar50 + lVar56 + lVar62 + lVar1);
                          auVar196._4_4_ = uVar53;
                          auVar196._0_4_ = uVar53;
                          auVar196._8_4_ = uVar53;
                          auVar196._12_4_ = uVar53;
                          uVar53 = *(undefined4 *)(local_1c08 + lVar56 + 4);
                          auVar204._4_4_ = uVar53;
                          auVar204._0_4_ = uVar53;
                          auVar204._8_4_ = uVar53;
                          auVar204._12_4_ = uVar53;
                          uVar53 = *(undefined4 *)(pGVar50 + lVar56 + lVar43 + 4);
                          auVar159._4_4_ = uVar53;
                          auVar159._0_4_ = uVar53;
                          auVar159._8_4_ = uVar53;
                          auVar159._12_4_ = uVar53;
                          uVar53 = *(undefined4 *)(pGVar50 + lVar56 + lVar62 + lVar1 + 4);
                          auVar104._4_4_ = uVar53;
                          auVar104._0_4_ = uVar53;
                          auVar104._8_4_ = uVar53;
                          auVar104._12_4_ = uVar53;
                          local_1ca8._4_4_ = *(undefined4 *)(pGVar44 + lVar56 + lVar59 + 0x2c);
                          local_1ca8._0_4_ = local_1ca8._4_4_;
                          local_1ca8._8_4_ = local_1ca8._4_4_;
                          local_1ca8._12_4_ = local_1ca8._4_4_;
                          local_1c98._4_4_ = *(undefined4 *)(pGVar44 + lVar56 + lVar42 + -4);
                          local_1c98._0_4_ = local_1c98._4_4_;
                          fStack_1c90 = (float)local_1c98._4_4_;
                          uStack_1c8c = local_1c98._4_4_;
                          local_1c88._4_4_ = *(undefined4 *)(pGVar44 + lVar56 + lVar41 + -4);
                          local_1c88._0_4_ = local_1c88._4_4_;
                          local_1c88._8_4_ = local_1c88._4_4_;
                          local_1c88._12_4_ = local_1c88._4_4_;
                          fVar100 = *(float *)(pGVar44 + lVar56 + lVar40 + 0x2c);
                          fVar3 = *(float *)(pGVar44 + lVar56 + lVar38 + 0x2c);
                          auVar83 = auVar127._0_16_;
                          fVar4 = *(float *)(pGVar44 + lVar56 + lVar36 + 0x2c);
                          fVar5 = *(float *)(pGVar44 + lVar56 + lVar40 + 0x30);
                          fVar6 = *(float *)(pGVar44 + lVar56 + lVar38 + 0x30);
                          fVar7 = *(float *)(pGVar44 + lVar56 + lVar36 + 0x30);
                          fVar8 = *(float *)(pGVar44 + lVar56 + lVar39 + 0x2c);
                          local_1a38 = auVar128._0_4_;
                          fStack_1a34 = auVar128._4_4_;
                          fStack_1a30 = auVar128._8_4_;
                          fStack_1a2c = auVar128._12_4_;
                          auVar130._0_4_ = local_1a38 * fVar100;
                          auVar130._4_4_ = fStack_1a34 * fVar100;
                          auVar130._8_4_ = fStack_1a30 * fVar100;
                          auVar130._12_4_ = fStack_1a2c * fVar100;
                          auVar74 = vfmadd231ps_fma(auVar130,auVar101,auVar171);
                          fVar100 = *(float *)(pGVar44 + lVar56 + lVar37 + 0x2c);
                          auVar208._0_4_ = local_1a38 * fVar3;
                          auVar208._4_4_ = fStack_1a34 * fVar3;
                          auVar208._8_4_ = fStack_1a30 * fVar3;
                          auVar208._12_4_ = fStack_1a2c * fVar3;
                          auVar214 = vfmadd231ps_fma(auVar208,auVar101,auVar186);
                          fVar3 = *(float *)(pGVar44 + lVar56 + lVar35 + 0x2c);
                          auVar84._0_4_ = local_1a38 * fVar4;
                          auVar84._4_4_ = fStack_1a34 * fVar4;
                          auVar84._8_4_ = fStack_1a30 * fVar4;
                          auVar84._12_4_ = fStack_1a2c * fVar4;
                          auVar202 = vfmadd231ps_fma(auVar84,auVar101,auVar196);
                          auVar145._0_4_ = local_1a38 * fVar5;
                          auVar145._4_4_ = fStack_1a34 * fVar5;
                          auVar145._8_4_ = fStack_1a30 * fVar5;
                          auVar145._12_4_ = fStack_1a2c * fVar5;
                          auVar217._0_4_ = local_1a38 * fVar6;
                          auVar217._4_4_ = fStack_1a34 * fVar6;
                          auVar217._8_4_ = fStack_1a30 * fVar6;
                          auVar217._12_4_ = fStack_1a2c * fVar6;
                          auVar197._0_4_ = local_1a38 * fVar7;
                          auVar197._4_4_ = fStack_1a34 * fVar7;
                          auVar197._8_4_ = fStack_1a30 * fVar7;
                          auVar197._12_4_ = fStack_1a2c * fVar7;
                          local_1808 = vfmadd231ps_fma(auVar145,auVar101,auVar204);
                          local_1818 = vfmadd231ps_fma(auVar217,auVar101,auVar159);
                          local_1bb8 = vfmadd231ps_fma(auVar197,auVar101,auVar104);
                          auVar223._0_4_ = local_1a38 * fVar8;
                          auVar223._4_4_ = fStack_1a34 * fVar8;
                          auVar223._8_4_ = fStack_1a30 * fVar8;
                          auVar223._12_4_ = fStack_1a2c * fVar8;
                          auVar105._0_4_ = local_1a38 * fVar100;
                          auVar105._4_4_ = fStack_1a34 * fVar100;
                          auVar105._8_4_ = fStack_1a30 * fVar100;
                          auVar105._12_4_ = fStack_1a2c * fVar100;
                          auVar172._0_4_ = local_1a38 * fVar3;
                          auVar172._4_4_ = fStack_1a34 * fVar3;
                          auVar172._8_4_ = fStack_1a30 * fVar3;
                          auVar172._12_4_ = fStack_1a2c * fVar3;
                          local_1828 = vfmadd231ps_fma(auVar223,auVar101,local_1ca8);
                          local_1838 = vfmadd231ps_fma(auVar105,auVar101,_local_1c98);
                          local_1848 = vfmadd231ps_fma(auVar172,auVar101,local_1c88);
                          auVar96 = *(undefined1 (*) [16])ray;
                          auVar73 = *(undefined1 (*) [16])(ray + 0x10);
                          auVar153 = *(undefined1 (*) [16])(ray + 0x20);
                          auVar155 = vsubps_avx(auVar74,auVar96);
                          auVar214 = vsubps_avx(auVar214,auVar73);
                          auVar202 = vsubps_avx(auVar202,auVar153);
                          auVar18 = vsubps_avx(local_1838,auVar73);
                          auVar19 = vsubps_avx(local_1848,auVar153);
                          auVar20 = vsubps_avx(auVar18,auVar214);
                          auVar142 = vsubps_avx(auVar19,auVar202);
                          auVar106._0_4_ = auVar18._0_4_ + auVar214._0_4_;
                          auVar106._4_4_ = auVar18._4_4_ + auVar214._4_4_;
                          auVar106._8_4_ = auVar18._8_4_ + auVar214._8_4_;
                          auVar106._12_4_ = auVar18._12_4_ + auVar214._12_4_;
                          fVar100 = auVar202._0_4_;
                          auVar131._0_4_ = auVar19._0_4_ + fVar100;
                          fVar3 = auVar202._4_4_;
                          auVar131._4_4_ = auVar19._4_4_ + fVar3;
                          fVar4 = auVar202._8_4_;
                          auVar131._8_4_ = auVar19._8_4_ + fVar4;
                          fVar5 = auVar202._12_4_;
                          auVar131._12_4_ = auVar19._12_4_ + fVar5;
                          auVar220._0_4_ = auVar106._0_4_ * auVar142._0_4_;
                          auVar220._4_4_ = auVar106._4_4_ * auVar142._4_4_;
                          auVar220._8_4_ = auVar106._8_4_ * auVar142._8_4_;
                          auVar220._12_4_ = auVar106._12_4_ * auVar142._12_4_;
                          auVar169 = vfmsub231ps_fma(auVar220,auVar20,auVar131);
                          auVar143 = vsubps_avx(local_1828,auVar96);
                          auVar156 = vsubps_avx(auVar143,auVar155);
                          auVar209._0_4_ = auVar131._0_4_ * auVar156._0_4_;
                          auVar209._4_4_ = auVar131._4_4_ * auVar156._4_4_;
                          auVar209._8_4_ = auVar131._8_4_ * auVar156._8_4_;
                          auVar209._12_4_ = auVar131._12_4_ * auVar156._12_4_;
                          auVar132._0_4_ = auVar143._0_4_ + auVar155._0_4_;
                          auVar132._4_4_ = auVar143._4_4_ + auVar155._4_4_;
                          auVar132._8_4_ = auVar143._8_4_ + auVar155._8_4_;
                          auVar132._12_4_ = auVar143._12_4_ + auVar155._12_4_;
                          auVar74 = vfmsub231ps_fma(auVar209,auVar142,auVar132);
                          auVar133._0_4_ = auVar132._0_4_ * auVar20._0_4_;
                          auVar133._4_4_ = auVar132._4_4_ * auVar20._4_4_;
                          auVar133._8_4_ = auVar132._8_4_ * auVar20._8_4_;
                          auVar133._12_4_ = auVar132._12_4_ * auVar20._12_4_;
                          auVar157 = vfmsub231ps_fma(auVar133,auVar156,auVar106);
                          fVar23 = *(float *)(ray + 0x60);
                          fVar24 = *(float *)(ray + 100);
                          fVar25 = *(float *)(ray + 0x68);
                          auVar29 = *(undefined1 (*) [12])(ray + 0x60);
                          fVar26 = *(float *)(ray + 0x6c);
                          auVar134._0_4_ = fVar23 * auVar157._0_4_;
                          auVar134._4_4_ = fVar24 * auVar157._4_4_;
                          auVar134._8_4_ = fVar25 * auVar157._8_4_;
                          auVar134._12_4_ = fVar26 * auVar157._12_4_;
                          local_1bf8 = *(undefined1 (*) [16])(ray + 0x50);
                          auVar157 = vfmadd231ps_fma(auVar134,local_1bf8,auVar74);
                          auVar74 = *(undefined1 (*) [16])(ray + 0x40);
                          auVar183 = vfmadd231ps_fma(auVar157,auVar74,auVar169);
                          auVar96 = vsubps_avx(local_1808,auVar96);
                          auVar73 = vsubps_avx(local_1818,auVar73);
                          auVar153 = vsubps_avx(local_1bb8,auVar153);
                          auVar157 = vsubps_avx(auVar214,auVar73);
                          auVar202 = vsubps_avx(auVar202,auVar153);
                          auVar160._0_4_ = auVar214._0_4_ + auVar73._0_4_;
                          auVar160._4_4_ = auVar214._4_4_ + auVar73._4_4_;
                          auVar160._8_4_ = auVar214._8_4_ + auVar73._8_4_;
                          auVar160._12_4_ = auVar214._12_4_ + auVar73._12_4_;
                          auVar218._0_4_ = fVar100 + auVar153._0_4_;
                          auVar218._4_4_ = fVar3 + auVar153._4_4_;
                          auVar218._8_4_ = fVar4 + auVar153._8_4_;
                          auVar218._12_4_ = fVar5 + auVar153._12_4_;
                          fVar207 = auVar202._0_4_;
                          auVar173._0_4_ = fVar207 * auVar160._0_4_;
                          fVar211 = auVar202._4_4_;
                          auVar173._4_4_ = fVar211 * auVar160._4_4_;
                          fVar212 = auVar202._8_4_;
                          auVar173._8_4_ = fVar212 * auVar160._8_4_;
                          fVar213 = auVar202._12_4_;
                          auVar173._12_4_ = fVar213 * auVar160._12_4_;
                          auVar184 = vfmsub231ps_fma(auVar173,auVar157,auVar218);
                          auVar169 = vsubps_avx(auVar155,auVar96);
                          fVar6 = auVar169._0_4_;
                          auVar219._0_4_ = auVar218._0_4_ * fVar6;
                          fVar8 = auVar169._4_4_;
                          auVar219._4_4_ = auVar218._4_4_ * fVar8;
                          fVar14 = auVar169._8_4_;
                          auVar219._8_4_ = auVar218._8_4_ * fVar14;
                          fVar16 = auVar169._12_4_;
                          auVar219._12_4_ = auVar218._12_4_ * fVar16;
                          auVar187._0_4_ = auVar155._0_4_ + auVar96._0_4_;
                          auVar187._4_4_ = auVar155._4_4_ + auVar96._4_4_;
                          auVar187._8_4_ = auVar155._8_4_ + auVar96._8_4_;
                          auVar187._12_4_ = auVar155._12_4_ + auVar96._12_4_;
                          auVar170 = vfmsub231ps_fma(auVar219,auVar202,auVar187);
                          fVar7 = auVar157._0_4_;
                          auVar188._0_4_ = auVar187._0_4_ * fVar7;
                          fVar13 = auVar157._4_4_;
                          auVar188._4_4_ = auVar187._4_4_ * fVar13;
                          fVar15 = auVar157._8_4_;
                          auVar188._8_4_ = auVar187._8_4_ * fVar15;
                          fVar17 = auVar157._12_4_;
                          auVar188._12_4_ = auVar187._12_4_ * fVar17;
                          auVar185 = vfmsub231ps_fma(auVar188,auVar169,auVar160);
                          auVar161._0_4_ = fVar23 * auVar185._0_4_;
                          auVar161._4_4_ = fVar24 * auVar185._4_4_;
                          auVar161._8_4_ = fVar25 * auVar185._8_4_;
                          auVar161._12_4_ = fVar26 * auVar185._12_4_;
                          auVar170 = vfmadd231ps_fma(auVar161,local_1bf8,auVar170);
                          auVar184 = vfmadd231ps_fma(auVar170,auVar74,auVar184);
                          auVar170 = vsubps_avx(auVar96,auVar143);
                          auVar66._0_4_ = auVar143._0_4_ + auVar96._0_4_;
                          auVar66._4_4_ = auVar143._4_4_ + auVar96._4_4_;
                          auVar66._8_4_ = auVar143._8_4_ + auVar96._8_4_;
                          auVar66._12_4_ = auVar143._12_4_ + auVar96._12_4_;
                          auVar143 = vsubps_avx(auVar73,auVar18);
                          auVar85._0_4_ = auVar18._0_4_ + auVar73._0_4_;
                          auVar85._4_4_ = auVar18._4_4_ + auVar73._4_4_;
                          auVar85._8_4_ = auVar18._8_4_ + auVar73._8_4_;
                          auVar85._12_4_ = auVar18._12_4_ + auVar73._12_4_;
                          auVar18 = vsubps_avx(auVar153,auVar19);
                          auVar107._0_4_ = auVar153._0_4_ + auVar19._0_4_;
                          auVar107._4_4_ = auVar153._4_4_ + auVar19._4_4_;
                          auVar107._8_4_ = auVar153._8_4_ + auVar19._8_4_;
                          auVar107._12_4_ = auVar153._12_4_ + auVar19._12_4_;
                          auVar146._0_4_ = auVar18._0_4_ * auVar85._0_4_;
                          auVar146._4_4_ = auVar18._4_4_ * auVar85._4_4_;
                          auVar146._8_4_ = auVar18._8_4_ * auVar85._8_4_;
                          auVar146._12_4_ = auVar18._12_4_ * auVar85._12_4_;
                          auVar73 = vfmsub231ps_fma(auVar146,auVar143,auVar107);
                          auVar108._0_4_ = auVar170._0_4_ * auVar107._0_4_;
                          auVar108._4_4_ = auVar170._4_4_ * auVar107._4_4_;
                          auVar108._8_4_ = auVar170._8_4_ * auVar107._8_4_;
                          auVar108._12_4_ = auVar170._12_4_ * auVar107._12_4_;
                          auVar96 = vfmsub231ps_fma(auVar108,auVar18,auVar66);
                          auVar67._0_4_ = auVar143._0_4_ * auVar66._0_4_;
                          auVar67._4_4_ = auVar143._4_4_ * auVar66._4_4_;
                          auVar67._8_4_ = auVar143._8_4_ * auVar66._8_4_;
                          auVar67._12_4_ = auVar143._12_4_ * auVar66._12_4_;
                          auVar153 = vfmsub231ps_fma(auVar67,auVar170,auVar85);
                          auVar68._0_4_ = fVar23 * auVar153._0_4_;
                          auVar68._4_4_ = fVar24 * auVar153._4_4_;
                          auVar68._8_4_ = fVar25 * auVar153._8_4_;
                          auVar68._12_4_ = fVar26 * auVar153._12_4_;
                          auVar96 = vfmadd231ps_fma(auVar68,local_1bf8,auVar96);
                          auVar153 = vfmadd231ps_fma(auVar96,auVar74,auVar73);
                          auVar174._0_8_ =
                               CONCAT44(auVar153._4_4_ + auVar183._4_4_ + auVar184._4_4_,
                                        auVar153._0_4_ + auVar183._0_4_ + auVar184._0_4_);
                          auVar174._8_4_ = auVar153._8_4_ + auVar183._8_4_ + auVar184._8_4_;
                          auVar174._12_4_ = auVar153._12_4_ + auVar183._12_4_ + auVar184._12_4_;
                          auVar96 = vandps_avx(auVar174,auVar222);
                          auVar86._0_4_ = auVar96._0_4_ * 1.1920929e-07;
                          auVar86._4_4_ = auVar96._4_4_ * 1.1920929e-07;
                          auVar86._8_4_ = auVar96._8_4_ * 1.1920929e-07;
                          auVar86._12_4_ = auVar96._12_4_ * 1.1920929e-07;
                          auVar96 = vminps_avx(auVar183,auVar184);
                          auVar96 = vminps_avx(auVar96,auVar153);
                          uVar49 = CONCAT44(auVar86._4_4_,auVar86._0_4_);
                          auVar147._0_8_ = uVar49 ^ 0x8000000080000000;
                          auVar147._8_4_ = -auVar86._8_4_;
                          auVar147._12_4_ = -auVar86._12_4_;
                          auVar96 = vcmpps_avx(auVar96,auVar147,5);
                          auVar73 = vmaxps_avx(auVar183,auVar184);
                          auVar73 = vmaxps_avx(auVar73,auVar153);
                          auVar73 = vcmpps_avx(auVar73,auVar86,2);
                          auVar96 = vorps_avx(auVar96,auVar73);
                          auVar73 = auVar83 & auVar96;
                          auVar96 = vandps_avx(auVar96,auVar83);
                          if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar73 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar73[0xf] < '\0') {
                            local_17f8 = auVar174;
                            auVar185 = local_17f8;
                            auVar69._0_4_ = fVar7 * auVar142._0_4_;
                            auVar69._4_4_ = fVar13 * auVar142._4_4_;
                            auVar69._8_4_ = fVar15 * auVar142._8_4_;
                            auVar69._12_4_ = fVar17 * auVar142._12_4_;
                            auVar198._0_4_ = fVar6 * auVar20._0_4_;
                            auVar198._4_4_ = fVar8 * auVar20._4_4_;
                            auVar198._8_4_ = fVar14 * auVar20._8_4_;
                            auVar198._12_4_ = fVar16 * auVar20._12_4_;
                            auVar19 = vfmsub213ps_fma(auVar20,auVar202,auVar69);
                            auVar109._0_4_ = auVar143._0_4_ * fVar207;
                            auVar109._4_4_ = auVar143._4_4_ * fVar211;
                            auVar109._8_4_ = auVar143._8_4_ * fVar212;
                            auVar109._12_4_ = auVar143._12_4_ * fVar213;
                            auVar148._0_4_ = fVar6 * auVar18._0_4_;
                            auVar148._4_4_ = fVar8 * auVar18._4_4_;
                            auVar148._8_4_ = fVar14 * auVar18._8_4_;
                            auVar148._12_4_ = fVar16 * auVar18._12_4_;
                            auVar18 = vfmsub213ps_fma(auVar18,auVar157,auVar109);
                            auVar73 = vandps_avx(auVar69,auVar222);
                            auVar153 = vandps_avx(auVar109,auVar222);
                            auVar73 = vcmpps_avx(auVar73,auVar153,1);
                            auVar18 = vblendvps_avx(auVar18,auVar19,auVar73);
                            auVar70._0_4_ = auVar170._0_4_ * fVar7;
                            auVar70._4_4_ = auVar170._4_4_ * fVar13;
                            auVar70._8_4_ = auVar170._8_4_ * fVar15;
                            auVar70._12_4_ = auVar170._12_4_ * fVar17;
                            auVar202 = vfmsub213ps_fma(auVar170,auVar202,auVar148);
                            auVar175._0_4_ = auVar156._0_4_ * fVar207;
                            auVar175._4_4_ = auVar156._4_4_ * fVar211;
                            auVar175._8_4_ = auVar156._8_4_ * fVar212;
                            auVar175._12_4_ = auVar156._12_4_ * fVar213;
                            auVar19 = vfmsub213ps_fma(auVar142,auVar169,auVar175);
                            auVar73 = vandps_avx(auVar175,auVar222);
                            auVar153 = vandps_avx(auVar148,auVar222);
                            auVar73 = vcmpps_avx(auVar73,auVar153,1);
                            auVar202 = vblendvps_avx(auVar202,auVar19,auVar73);
                            auVar19 = vfmsub213ps_fma(auVar156,auVar157,auVar198);
                            auVar143 = vfmsub213ps_fma(auVar143,auVar169,auVar70);
                            auVar73 = vandps_avx(auVar198,auVar222);
                            auVar153 = vandps_avx(auVar70,auVar222);
                            auVar73 = vcmpps_avx(auVar73,auVar153,1);
                            auVar153 = vblendvps_avx(auVar143,auVar19,auVar73);
                            local_1b18 = auVar29._0_4_;
                            fStack_1b14 = auVar29._4_4_;
                            fStack_1b10 = auVar29._8_4_;
                            auVar71._0_4_ = auVar153._0_4_ * local_1b18;
                            auVar71._4_4_ = auVar153._4_4_ * fStack_1b14;
                            auVar71._8_4_ = auVar153._8_4_ * fStack_1b10;
                            auVar71._12_4_ = auVar153._12_4_ * fVar26;
                            auVar73 = vfmadd213ps_fma(local_1bf8,auVar202,auVar71);
                            auVar73 = vfmadd213ps_fma(auVar74,auVar18,auVar73);
                            auVar72._0_4_ = auVar73._0_4_ + auVar73._0_4_;
                            auVar72._4_4_ = auVar73._4_4_ + auVar73._4_4_;
                            auVar72._8_4_ = auVar73._8_4_ + auVar73._8_4_;
                            auVar72._12_4_ = auVar73._12_4_ + auVar73._12_4_;
                            auVar87._0_4_ = auVar153._0_4_ * fVar100;
                            auVar87._4_4_ = auVar153._4_4_ * fVar3;
                            auVar87._8_4_ = auVar153._8_4_ * fVar4;
                            auVar87._12_4_ = auVar153._12_4_ * fVar5;
                            auVar73 = vfmadd213ps_fma(auVar214,auVar202,auVar87);
                            auVar74 = vfmadd213ps_fma(auVar155,auVar18,auVar73);
                            auVar73 = vrcpps_avx(auVar72);
                            auVar205._8_4_ = 0x3f800000;
                            auVar205._0_8_ = 0x3f8000003f800000;
                            auVar205._12_4_ = 0x3f800000;
                            auVar155 = vfnmadd213ps_fma(auVar73,auVar72,auVar205);
                            auVar73 = vfmadd132ps_fma(auVar155,auVar73,auVar73);
                            auVar88._0_4_ = auVar73._0_4_ * (auVar74._0_4_ + auVar74._0_4_);
                            auVar88._4_4_ = auVar73._4_4_ * (auVar74._4_4_ + auVar74._4_4_);
                            auVar88._8_4_ = auVar73._8_4_ * (auVar74._8_4_ + auVar74._8_4_);
                            auVar88._12_4_ = auVar73._12_4_ * (auVar74._12_4_ + auVar74._12_4_);
                            auVar73 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar88,2);
                            auVar74 = vcmpps_avx(auVar88,*(undefined1 (*) [16])(ray + 0x80),2);
                            auVar73 = vandps_avx(auVar74,auVar73);
                            uVar49 = CONCAT44(auVar72._4_4_,auVar72._0_4_);
                            auVar199._0_8_ = uVar49 ^ 0x8000000080000000;
                            auVar199._8_4_ = -auVar72._8_4_;
                            auVar199._12_4_ = -auVar72._12_4_;
                            auVar74 = vcmpps_avx(auVar199,auVar72,4);
                            auVar73 = vandps_avx(auVar74,auVar73);
                            auVar73 = vpslld_avx(auVar73,0x1f);
                            auVar74 = vpsrad_avx(auVar73,0x1f);
                            auVar73 = auVar96 & auVar74;
                            auVar96 = vandps_avx(auVar74,auVar96);
                            local_17f8 = auVar185;
                            if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar73 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || auVar73[0xf] < '\0') {
                              _local_1858 = auVar183;
                              _local_1868 = auVar184;
                              local_17f8._8_8_ = auVar174._8_8_;
                              local_1878 = auVar174._0_8_;
                              uStack_1870 = local_17f8._8_8_;
                              local_1888 = auVar88;
                              local_1898 = auVar18;
                              local_18a8 = auVar202;
                              local_18b8 = auVar153;
                            }
                          }
                          uVar53 = *(undefined4 *)(pGVar44 + lVar56 + lVar39 + 0x30);
                          local_1be8._4_4_ = uVar53;
                          local_1be8._0_4_ = uVar53;
                          local_1be8._8_4_ = uVar53;
                          local_1be8._12_4_ = uVar53;
                          fVar100 = *(float *)(pGVar44 + lVar56 + lVar37 + 0x30);
                          fVar3 = *(float *)(pGVar44 + lVar56 + lVar35 + 0x30);
                          uVar53 = *(undefined4 *)(pGVar44 + lVar56 + lVar59 + 0x30);
                          auVar215._4_4_ = uVar53;
                          auVar215._0_4_ = uVar53;
                          auVar215._8_4_ = uVar53;
                          auVar215._12_4_ = uVar53;
                          uVar53 = *(undefined4 *)(pGVar44 + lVar56 + lVar42);
                          local_1bc8._4_4_ = uVar53;
                          local_1bc8._0_4_ = uVar53;
                          local_1bc8._8_4_ = uVar53;
                          local_1bc8._12_4_ = uVar53;
                          uVar53 = *(undefined4 *)(pGVar44 + lVar56 + lVar41);
                          local_1bd8._4_4_ = uVar53;
                          local_1bd8._0_4_ = uVar53;
                          local_1bd8._8_4_ = uVar53;
                          local_1bd8._12_4_ = uVar53;
                          uVar10 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                          pGVar11 = (context->scene->geometries).items[uVar10].ptr;
                          uVar21 = pGVar11->mask;
                          auVar89._4_4_ = uVar21;
                          auVar89._0_4_ = uVar21;
                          auVar89._8_4_ = uVar21;
                          auVar89._12_4_ = uVar21;
                          auVar73 = vpand_avx(auVar89,*(undefined1 (*) [16])(ray + 0x90));
                          auVar73 = vpcmpeqd_avx(auVar73,_DAT_01f7aa10);
                          auVar153 = auVar96 & ~auVar73;
                          auVar74 = local_1be8;
                          auVar155 = local_1bc8;
                          auVar214 = local_1bd8;
                          if ((((auVar153 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar153 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar153 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar153[0xf] < '\0') {
                            uVar53 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                            auVar96 = vandnps_avx(auVar73,auVar96);
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar28._8_8_ = uStack_1870;
                              auVar28._0_8_ = local_1878;
                              auVar73 = vandps_avx(auVar222,auVar28);
                              auVar153 = vrcpps_avx(auVar28);
                              auVar191._8_4_ = 0x3f800000;
                              auVar191._0_8_ = 0x3f8000003f800000;
                              auVar191._12_4_ = 0x3f800000;
                              auVar74 = vfnmadd213ps_fma(auVar153,auVar28,auVar191);
                              auVar153 = vfmadd132ps_fma(auVar74,auVar153,auVar153);
                              auVar115._8_4_ = 0x219392ef;
                              auVar115._0_8_ = 0x219392ef219392ef;
                              auVar115._12_4_ = 0x219392ef;
                              auVar73 = vcmpps_avx(auVar73,auVar115,5);
                              auVar73 = vandps_avx(auVar73,auVar153);
                              auVar97._0_4_ = auVar73._0_4_ * (float)local_1858._0_4_;
                              auVar97._4_4_ = auVar73._4_4_ * (float)local_1858._4_4_;
                              auVar97._8_4_ = auVar73._8_4_ * fStack_1850;
                              auVar97._12_4_ = auVar73._12_4_ * fStack_184c;
                              auVar74 = vminps_avx(auVar97,auVar191);
                              auVar116._0_4_ = auVar73._0_4_ * (float)local_1868._0_4_;
                              auVar116._4_4_ = auVar73._4_4_ * (float)local_1868._4_4_;
                              auVar116._8_4_ = auVar73._8_4_ * fStack_1860;
                              auVar116._12_4_ = auVar73._12_4_ * fStack_185c;
                              auVar155 = vminps_avx(auVar116,auVar191);
                              uVar9 = *(undefined4 *)(pGVar44 + lVar56 + lVar34 + 0x2c);
                              auVar137._4_4_ = uVar9;
                              auVar137._0_4_ = uVar9;
                              auVar137._8_4_ = uVar9;
                              auVar137._12_4_ = uVar9;
                              auVar153 = vpsrld_avx(auVar137,0x10);
                              auVar202 = ZEXT816(0) << 0x20;
                              auVar73 = vpblendw_avx(auVar137,auVar202,0xaa);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar153 = vcvtdq2ps_avx(auVar153);
                              uVar9 = *(undefined4 *)(pGVar44 + lVar56 + lVar34 + 0x30);
                              auVar138._4_4_ = uVar9;
                              auVar138._0_4_ = uVar9;
                              auVar138._8_4_ = uVar9;
                              auVar138._12_4_ = uVar9;
                              uVar9 = *(undefined4 *)(pGVar44 + lVar56 + lVar33 + 0x2c);
                              auVar179._4_4_ = uVar9;
                              auVar179._0_4_ = uVar9;
                              auVar179._8_4_ = uVar9;
                              auVar179._12_4_ = uVar9;
                              auVar214 = vsubps_avx(auVar191,auVar74);
                              auVar214 = vsubps_avx(auVar214,auVar155);
                              auVar167._0_4_ = auVar214._0_4_ * auVar73._0_4_ * 0.00012207031;
                              auVar167._4_4_ = auVar214._4_4_ * auVar73._4_4_ * 0.00012207031;
                              auVar167._8_4_ = auVar214._8_4_ * auVar73._8_4_ * 0.00012207031;
                              auVar167._12_4_ = auVar214._12_4_ * auVar73._12_4_ * 0.00012207031;
                              auVar152._0_4_ = auVar214._0_4_ * auVar153._0_4_ * 0.00012207031;
                              auVar152._4_4_ = auVar214._4_4_ * auVar153._4_4_ * 0.00012207031;
                              auVar152._8_4_ = auVar214._8_4_ * auVar153._8_4_ * 0.00012207031;
                              auVar152._12_4_ = auVar214._12_4_ * auVar153._12_4_ * 0.00012207031;
                              auVar73 = vpblendw_avx(auVar179,auVar202,0xaa);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar192._0_4_ = auVar73._0_4_ * 0.00012207031;
                              auVar192._4_4_ = auVar73._4_4_ * 0.00012207031;
                              auVar192._8_4_ = auVar73._8_4_ * 0.00012207031;
                              auVar192._12_4_ = auVar73._12_4_ * 0.00012207031;
                              auVar153 = vfmadd231ps_fma(auVar167,auVar155,auVar192);
                              auVar73 = vpsrld_avx(auVar179,0x10);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar180._0_4_ = auVar73._0_4_ * 0.00012207031;
                              auVar180._4_4_ = auVar73._4_4_ * 0.00012207031;
                              auVar180._8_4_ = auVar73._8_4_ * 0.00012207031;
                              auVar180._12_4_ = auVar73._12_4_ * 0.00012207031;
                              auVar155 = vfmadd231ps_fma(auVar152,auVar155,auVar180);
                              auVar73 = vpblendw_avx(auVar138,auVar202,0xaa);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar117._0_4_ = auVar73._0_4_ * 0.00012207031;
                              auVar117._4_4_ = auVar73._4_4_ * 0.00012207031;
                              auVar117._8_4_ = auVar73._8_4_ * 0.00012207031;
                              auVar117._12_4_ = auVar73._12_4_ * 0.00012207031;
                              local_19e8 = vfmadd231ps_fma(auVar153,auVar74,auVar117);
                              auVar73 = vpsrld_avx(auVar138,0x10);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar118._0_4_ = auVar73._0_4_ * 0.00012207031;
                              auVar118._4_4_ = auVar73._4_4_ * 0.00012207031;
                              auVar118._8_4_ = auVar73._8_4_ * 0.00012207031;
                              auVar118._12_4_ = auVar73._12_4_ * 0.00012207031;
                              local_19d8 = vfmadd231ps_fma(auVar155,auVar74,auVar118);
                              local_1a18 = local_1898._0_8_;
                              uStack_1a10 = local_1898._8_8_;
                              local_1a08 = local_18a8._0_8_;
                              uStack_1a00 = local_18a8._8_8_;
                              local_19f8 = local_18b8._0_8_;
                              uStack_19f0 = local_18b8._8_8_;
                              local_19b8._4_4_ = uVar10;
                              local_19b8._0_4_ = uVar10;
                              local_19b8._8_4_ = uVar10;
                              local_19b8._12_4_ = uVar10;
                              local_19c8._4_4_ = uVar53;
                              local_19c8._0_4_ = uVar53;
                              local_19c8._8_4_ = uVar53;
                              local_19c8._12_4_ = uVar53;
                              vpcmpeqd_avx2(ZEXT1632(local_19b8),ZEXT1632(local_19b8));
                              uStack_19a4 = context->user->instID[0];
                              local_19a8 = uStack_19a4;
                              uStack_19a0 = uStack_19a4;
                              uStack_199c = uStack_19a4;
                              uStack_1998 = context->user->instPrimID[0];
                              uStack_1994 = uStack_1998;
                              uStack_1990 = uStack_1998;
                              uStack_198c = uStack_1998;
                              local_1bf8 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar73 = vblendvps_avx(local_1bf8,local_1888,auVar96);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar73;
                              args.valid = (int *)local_1c28;
                              args.geometryUserPtr = pGVar11->userPtr;
                              args.context = context->user;
                              args.hit = (RTCHitN *)&local_1a18;
                              args.N = 4;
                              local_1c28 = auVar96;
                              args.ray = (RTCRayN *)ray;
                              if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar11->occlusionFilterN)(&args);
                              }
                              if (local_1c28 == (undefined1  [16])0x0) {
                                auVar96 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                auVar96 = auVar96 ^ _DAT_01f7ae20;
                              }
                              else {
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var12)(&args);
                                }
                                auVar73 = vpcmpeqd_avx(local_1c28,_DAT_01f7aa10);
                                auVar96 = auVar73 ^ _DAT_01f7ae20;
                                auVar124._8_4_ = 0xff800000;
                                auVar124._0_8_ = 0xff800000ff800000;
                                auVar124._12_4_ = 0xff800000;
                                auVar73 = vblendvps_avx(auVar124,*(undefined1 (*) [16])
                                                                  (args.ray + 0x80),auVar73);
                                *(undefined1 (*) [16])(args.ray + 0x80) = auVar73;
                              }
                              auVar73 = vpslld_avx(auVar96,0x1f);
                              auVar96 = vpsrad_avx(auVar73,0x1f);
                              auVar73 = vblendvps_avx(local_1bf8,*(undefined1 (*) [16])local_1c10,
                                                      auVar73);
                              *(undefined1 (*) [16])local_1c10 = auVar73;
                              auVar156 = local_1be8;
                              auVar20 = local_1bd8;
                              auVar142 = local_1bc8;
                              auVar74 = local_1be8;
                              auVar155 = local_1bc8;
                              auVar214 = local_1bd8;
                            }
                            local_1bc8 = auVar142;
                            local_1bd8 = auVar20;
                            local_1be8 = auVar156;
                            auVar83 = vpandn_avx(auVar96,auVar83);
                            auVar156 = local_1be8;
                            auVar20 = local_1bd8;
                            auVar142 = local_1bc8;
                          }
                          local_1bc8 = auVar142;
                          local_1bd8 = auVar20;
                          local_1be8 = auVar156;
                          auVar127 = ZEXT1664(auVar83);
                          if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar83 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar83 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar83[0xf]) break;
                          auVar75._0_4_ = auVar74._0_4_ * local_1a38;
                          auVar75._4_4_ = auVar74._4_4_ * fStack_1a34;
                          auVar75._8_4_ = auVar74._8_4_ * fStack_1a30;
                          auVar75._12_4_ = auVar74._12_4_ * fStack_1a2c;
                          auVar90._0_4_ = local_1a38 * fVar100;
                          auVar90._4_4_ = fStack_1a34 * fVar100;
                          auVar90._8_4_ = fStack_1a30 * fVar100;
                          auVar90._12_4_ = fStack_1a2c * fVar100;
                          auVar110._0_4_ = local_1a38 * fVar3;
                          auVar110._4_4_ = fStack_1a34 * fVar3;
                          auVar110._8_4_ = fStack_1a30 * fVar3;
                          auVar110._12_4_ = fStack_1a2c * fVar3;
                          auVar19 = vfmadd213ps_fma(auVar215,auVar101,auVar75);
                          auVar20 = vfmadd213ps_fma(auVar155,auVar101,auVar90);
                          auVar142 = vfmadd213ps_fma(auVar214,auVar101,auVar110);
                          auVar96 = *(undefined1 (*) [16])ray;
                          auVar73 = *(undefined1 (*) [16])(ray + 0x10);
                          auVar153 = *(undefined1 (*) [16])(ray + 0x20);
                          auVar74 = vsubps_avx(local_1828,auVar96);
                          auVar155 = vsubps_avx(local_1838,auVar73);
                          local_1bc8 = vsubps_avx(local_1848,auVar153);
                          auVar214 = vsubps_avx(local_1808,auVar96);
                          auVar202 = vsubps_avx(local_1818,auVar73);
                          auVar18 = vsubps_avx(local_1bb8,auVar153);
                          auVar19 = vsubps_avx(auVar19,auVar96);
                          auVar73 = vsubps_avx(auVar20,auVar73);
                          auVar153 = vsubps_avx(auVar142,auVar153);
                          local_1bd8 = vsubps_avx(auVar19,auVar74);
                          local_1bf8 = vsubps_avx(auVar73,auVar155);
                          local_1be8 = vsubps_avx(auVar153,local_1bc8);
                          auVar135._0_4_ = auVar19._0_4_ + auVar74._0_4_;
                          auVar135._4_4_ = auVar19._4_4_ + auVar74._4_4_;
                          auVar135._8_4_ = auVar19._8_4_ + auVar74._8_4_;
                          auVar135._12_4_ = auVar19._12_4_ + auVar74._12_4_;
                          auVar176._0_4_ = auVar73._0_4_ + auVar155._0_4_;
                          auVar176._4_4_ = auVar73._4_4_ + auVar155._4_4_;
                          auVar176._8_4_ = auVar73._8_4_ + auVar155._8_4_;
                          auVar176._12_4_ = auVar73._12_4_ + auVar155._12_4_;
                          fVar207 = local_1bc8._0_4_;
                          auVar200._0_4_ = fVar207 + auVar153._0_4_;
                          fVar211 = local_1bc8._4_4_;
                          auVar200._4_4_ = fVar211 + auVar153._4_4_;
                          fVar212 = local_1bc8._8_4_;
                          auVar200._8_4_ = fVar212 + auVar153._8_4_;
                          fVar213 = local_1bc8._12_4_;
                          auVar200._12_4_ = fVar213 + auVar153._12_4_;
                          auVar216._0_4_ = auVar176._0_4_ * local_1be8._0_4_;
                          auVar216._4_4_ = auVar176._4_4_ * local_1be8._4_4_;
                          auVar216._8_4_ = auVar176._8_4_ * local_1be8._8_4_;
                          auVar216._12_4_ = auVar176._12_4_ * local_1be8._12_4_;
                          auVar142 = vfmsub231ps_fma(auVar216,local_1bf8,auVar200);
                          auVar210._0_4_ = auVar200._0_4_ * local_1bd8._0_4_;
                          auVar210._4_4_ = auVar200._4_4_ * local_1bd8._4_4_;
                          auVar210._8_4_ = auVar200._8_4_ * local_1bd8._8_4_;
                          auVar210._12_4_ = auVar200._12_4_ * local_1bd8._12_4_;
                          auVar96 = vfmsub231ps_fma(auVar210,local_1be8,auVar135);
                          auVar136._0_4_ = auVar135._0_4_ * local_1bf8._0_4_;
                          auVar136._4_4_ = auVar135._4_4_ * local_1bf8._4_4_;
                          auVar136._8_4_ = auVar135._8_4_ * local_1bf8._8_4_;
                          auVar136._12_4_ = auVar135._12_4_ * local_1bf8._12_4_;
                          auVar20 = vfmsub231ps_fma(auVar136,local_1bd8,auVar176);
                          fVar23 = *(float *)(ray + 0x60);
                          fVar24 = *(float *)(ray + 100);
                          fVar25 = *(float *)(ray + 0x68);
                          auVar29 = *(undefined1 (*) [12])(ray + 0x60);
                          fVar26 = *(float *)(ray + 0x6c);
                          auVar221._0_4_ = fVar23 * auVar20._0_4_;
                          auVar221._4_4_ = fVar24 * auVar20._4_4_;
                          auVar221._8_4_ = fVar25 * auVar20._8_4_;
                          auVar221._12_4_ = fVar26 * auVar20._12_4_;
                          local_1bb8 = *(undefined1 (*) [16])(ray + 0x50);
                          auVar20 = vfmadd231ps_fma(auVar221,local_1bb8,auVar96);
                          auVar96 = *(undefined1 (*) [16])(ray + 0x40);
                          auVar157 = vfmadd231ps_fma(auVar20,auVar96,auVar142);
                          auVar20 = vsubps_avx(auVar155,auVar202);
                          auVar142 = vsubps_avx(local_1bc8,auVar18);
                          auVar177._0_4_ = auVar155._0_4_ + auVar202._0_4_;
                          auVar177._4_4_ = auVar155._4_4_ + auVar202._4_4_;
                          auVar177._8_4_ = auVar155._8_4_ + auVar202._8_4_;
                          auVar177._12_4_ = auVar155._12_4_ + auVar202._12_4_;
                          auVar224._0_4_ = fVar207 + auVar18._0_4_;
                          auVar224._4_4_ = fVar211 + auVar18._4_4_;
                          auVar224._8_4_ = fVar212 + auVar18._8_4_;
                          auVar224._12_4_ = fVar213 + auVar18._12_4_;
                          fVar100 = auVar142._0_4_;
                          auVar162._0_4_ = auVar177._0_4_ * fVar100;
                          fVar5 = auVar142._4_4_;
                          auVar162._4_4_ = auVar177._4_4_ * fVar5;
                          fVar8 = auVar142._8_4_;
                          auVar162._8_4_ = auVar177._8_4_ * fVar8;
                          fVar15 = auVar142._12_4_;
                          auVar162._12_4_ = auVar177._12_4_ * fVar15;
                          auVar169 = vfmsub231ps_fma(auVar162,auVar20,auVar224);
                          auVar143 = vsubps_avx(auVar74,auVar214);
                          fVar3 = auVar143._0_4_;
                          auVar225._0_4_ = auVar224._0_4_ * fVar3;
                          fVar6 = auVar143._4_4_;
                          auVar225._4_4_ = auVar224._4_4_ * fVar6;
                          fVar13 = auVar143._8_4_;
                          auVar225._8_4_ = auVar224._8_4_ * fVar13;
                          fVar16 = auVar143._12_4_;
                          auVar225._12_4_ = auVar224._12_4_ * fVar16;
                          auVar189._0_4_ = auVar74._0_4_ + auVar214._0_4_;
                          auVar189._4_4_ = auVar74._4_4_ + auVar214._4_4_;
                          auVar189._8_4_ = auVar74._8_4_ + auVar214._8_4_;
                          auVar189._12_4_ = auVar74._12_4_ + auVar214._12_4_;
                          auVar156 = vfmsub231ps_fma(auVar225,auVar142,auVar189);
                          fVar4 = auVar20._0_4_;
                          auVar190._0_4_ = auVar189._0_4_ * fVar4;
                          fVar7 = auVar20._4_4_;
                          auVar190._4_4_ = auVar189._4_4_ * fVar7;
                          fVar14 = auVar20._8_4_;
                          auVar190._8_4_ = auVar189._8_4_ * fVar14;
                          fVar17 = auVar20._12_4_;
                          auVar190._12_4_ = auVar189._12_4_ * fVar17;
                          auVar170 = vfmsub231ps_fma(auVar190,auVar143,auVar177);
                          auVar178._0_4_ = fVar23 * auVar170._0_4_;
                          auVar178._4_4_ = fVar24 * auVar170._4_4_;
                          auVar178._8_4_ = fVar25 * auVar170._8_4_;
                          auVar178._12_4_ = fVar26 * auVar170._12_4_;
                          auVar156 = vfmadd231ps_fma(auVar178,local_1bb8,auVar156);
                          auVar169 = vfmadd231ps_fma(auVar156,auVar96,auVar169);
                          auVar156 = vsubps_avx(auVar214,auVar19);
                          auVar91._0_4_ = auVar19._0_4_ + auVar214._0_4_;
                          auVar91._4_4_ = auVar19._4_4_ + auVar214._4_4_;
                          auVar91._8_4_ = auVar19._8_4_ + auVar214._8_4_;
                          auVar91._12_4_ = auVar19._12_4_ + auVar214._12_4_;
                          auVar214 = vsubps_avx(auVar202,auVar73);
                          auVar76._0_4_ = auVar202._0_4_ + auVar73._0_4_;
                          auVar76._4_4_ = auVar202._4_4_ + auVar73._4_4_;
                          auVar76._8_4_ = auVar202._8_4_ + auVar73._8_4_;
                          auVar76._12_4_ = auVar202._12_4_ + auVar73._12_4_;
                          auVar202 = vsubps_avx(auVar18,auVar153);
                          auVar111._0_4_ = auVar18._0_4_ + auVar153._0_4_;
                          auVar111._4_4_ = auVar18._4_4_ + auVar153._4_4_;
                          auVar111._8_4_ = auVar18._8_4_ + auVar153._8_4_;
                          auVar111._12_4_ = auVar18._12_4_ + auVar153._12_4_;
                          auVar149._0_4_ = auVar202._0_4_ * auVar76._0_4_;
                          auVar149._4_4_ = auVar202._4_4_ * auVar76._4_4_;
                          auVar149._8_4_ = auVar202._8_4_ * auVar76._8_4_;
                          auVar149._12_4_ = auVar202._12_4_ * auVar76._12_4_;
                          auVar153 = vfmsub231ps_fma(auVar149,auVar214,auVar111);
                          auVar112._0_4_ = auVar156._0_4_ * auVar111._0_4_;
                          auVar112._4_4_ = auVar156._4_4_ * auVar111._4_4_;
                          auVar112._8_4_ = auVar156._8_4_ * auVar111._8_4_;
                          auVar112._12_4_ = auVar156._12_4_ * auVar111._12_4_;
                          auVar73 = vfmsub231ps_fma(auVar112,auVar202,auVar91);
                          auVar92._0_4_ = auVar214._0_4_ * auVar91._0_4_;
                          auVar92._4_4_ = auVar214._4_4_ * auVar91._4_4_;
                          auVar92._8_4_ = auVar214._8_4_ * auVar91._8_4_;
                          auVar92._12_4_ = auVar214._12_4_ * auVar91._12_4_;
                          auVar18 = vfmsub231ps_fma(auVar92,auVar156,auVar76);
                          auVar77._0_4_ = fVar23 * auVar18._0_4_;
                          auVar77._4_4_ = fVar24 * auVar18._4_4_;
                          auVar77._8_4_ = fVar25 * auVar18._8_4_;
                          auVar77._12_4_ = fVar26 * auVar18._12_4_;
                          auVar73 = vfmadd231ps_fma(auVar77,local_1bb8,auVar73);
                          auVar18 = vfmadd231ps_fma(auVar73,auVar96,auVar153);
                          auVar163._0_4_ = auVar18._0_4_ + auVar157._0_4_ + auVar169._0_4_;
                          auVar163._4_4_ = auVar18._4_4_ + auVar157._4_4_ + auVar169._4_4_;
                          auVar163._8_4_ = auVar18._8_4_ + auVar157._8_4_ + auVar169._8_4_;
                          auVar163._12_4_ = auVar18._12_4_ + auVar157._12_4_ + auVar169._12_4_;
                          auVar73 = vandps_avx(auVar222,auVar163);
                          auVar93._0_4_ = auVar73._0_4_ * 1.1920929e-07;
                          auVar93._4_4_ = auVar73._4_4_ * 1.1920929e-07;
                          auVar93._8_4_ = auVar73._8_4_ * 1.1920929e-07;
                          auVar93._12_4_ = auVar73._12_4_ * 1.1920929e-07;
                          auVar73 = vminps_avx(auVar157,auVar169);
                          auVar73 = vminps_avx(auVar73,auVar18);
                          uVar49 = CONCAT44(auVar93._4_4_,auVar93._0_4_);
                          auVar150._0_8_ = uVar49 ^ 0x8000000080000000;
                          auVar150._8_4_ = -auVar93._8_4_;
                          auVar150._12_4_ = -auVar93._12_4_;
                          auVar73 = vcmpps_avx(auVar73,auVar150,5);
                          auVar153 = vmaxps_avx(auVar157,auVar169);
                          auVar153 = vmaxps_avx(auVar153,auVar18);
                          auVar153 = vcmpps_avx(auVar153,auVar93,2);
                          auVar73 = vorps_avx(auVar73,auVar153);
                          auVar153 = auVar83 & auVar73;
                          auVar73 = vandps_avx(auVar73,auVar83);
                          if ((((auVar153 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar153 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar153 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar153[0xf] < '\0') {
                            auVar78._0_4_ = fVar4 * local_1be8._0_4_;
                            auVar78._4_4_ = fVar7 * local_1be8._4_4_;
                            auVar78._8_4_ = fVar14 * local_1be8._8_4_;
                            auVar78._12_4_ = fVar17 * local_1be8._12_4_;
                            local_1b28._4_4_ = fVar6 * local_1bf8._4_4_;
                            local_1b28._0_4_ = fVar3 * local_1bf8._0_4_;
                            fStack_1b20 = fVar13 * local_1bf8._8_4_;
                            fStack_1b1c = fVar16 * local_1bf8._12_4_;
                            auVar18 = vfmsub213ps_fma(local_1bf8,auVar142,auVar78);
                            auVar113._0_4_ = auVar214._0_4_ * fVar100;
                            auVar113._4_4_ = auVar214._4_4_ * fVar5;
                            auVar113._8_4_ = auVar214._8_4_ * fVar8;
                            auVar113._12_4_ = auVar214._12_4_ * fVar15;
                            auVar151._0_4_ = fVar3 * auVar202._0_4_;
                            auVar151._4_4_ = fVar6 * auVar202._4_4_;
                            auVar151._8_4_ = fVar13 * auVar202._8_4_;
                            auVar151._12_4_ = fVar16 * auVar202._12_4_;
                            auVar19 = vfmsub213ps_fma(auVar202,auVar20,auVar113);
                            auVar153 = vandps_avx(auVar222,auVar78);
                            auVar202 = vandps_avx(auVar222,auVar113);
                            auVar153 = vcmpps_avx(auVar153,auVar202,1);
                            auVar18 = vblendvps_avx(auVar19,auVar18,auVar153);
                            auVar164._0_4_ = auVar156._0_4_ * fVar4;
                            auVar164._4_4_ = auVar156._4_4_ * fVar7;
                            auVar164._8_4_ = auVar156._8_4_ * fVar14;
                            auVar164._12_4_ = auVar156._12_4_ * fVar17;
                            auVar19 = vfmsub213ps_fma(auVar156,auVar142,auVar151);
                            auVar114._0_4_ = local_1bd8._0_4_ * fVar100;
                            auVar114._4_4_ = local_1bd8._4_4_ * fVar5;
                            auVar114._8_4_ = local_1bd8._8_4_ * fVar8;
                            auVar114._12_4_ = local_1bd8._12_4_ * fVar15;
                            auVar142 = vfmsub213ps_fma(local_1be8,auVar143,auVar114);
                            auVar153 = vandps_avx(auVar222,auVar114);
                            auVar202 = vandps_avx(auVar222,auVar151);
                            auVar153 = vcmpps_avx(auVar153,auVar202,1);
                            auVar202 = vblendvps_avx(auVar19,auVar142,auVar153);
                            auVar19 = vfmsub213ps_fma(local_1bd8,auVar20,_local_1b28);
                            auVar20 = vfmsub213ps_fma(auVar214,auVar143,auVar164);
                            auVar153 = vandps_avx(auVar222,_local_1b28);
                            auVar214 = vandps_avx(auVar222,auVar164);
                            auVar153 = vcmpps_avx(auVar153,auVar214,1);
                            auVar153 = vblendvps_avx(auVar20,auVar19,auVar153);
                            local_1c98._0_4_ = auVar29._0_4_;
                            local_1c98._4_4_ = auVar29._4_4_;
                            fStack_1c90 = auVar29._8_4_;
                            auVar94._0_4_ = auVar153._0_4_ * (float)local_1c98._0_4_;
                            auVar94._4_4_ = auVar153._4_4_ * (float)local_1c98._4_4_;
                            auVar94._8_4_ = auVar153._8_4_ * fStack_1c90;
                            auVar94._12_4_ = auVar153._12_4_ * fVar26;
                            auVar214 = vfmadd213ps_fma(local_1bb8,auVar202,auVar94);
                            auVar96 = vfmadd213ps_fma(auVar96,auVar18,auVar214);
                            auVar95._0_4_ = auVar96._0_4_ + auVar96._0_4_;
                            auVar95._4_4_ = auVar96._4_4_ + auVar96._4_4_;
                            auVar95._8_4_ = auVar96._8_4_ + auVar96._8_4_;
                            auVar95._12_4_ = auVar96._12_4_ + auVar96._12_4_;
                            auVar165._0_4_ = auVar153._0_4_ * fVar207;
                            auVar165._4_4_ = auVar153._4_4_ * fVar211;
                            auVar165._8_4_ = auVar153._8_4_ * fVar212;
                            auVar165._12_4_ = auVar153._12_4_ * fVar213;
                            auVar96 = vfmadd213ps_fma(auVar155,auVar202,auVar165);
                            auVar74 = vfmadd213ps_fma(auVar74,auVar18,auVar96);
                            auVar96 = vrcpps_avx(auVar95);
                            auVar206._8_4_ = 0x3f800000;
                            auVar206._0_8_ = 0x3f8000003f800000;
                            auVar206._12_4_ = 0x3f800000;
                            auVar155 = vfnmadd213ps_fma(auVar96,auVar95,auVar206);
                            auVar96 = vfmadd132ps_fma(auVar155,auVar96,auVar96);
                            auVar166._0_4_ = auVar96._0_4_ * (auVar74._0_4_ + auVar74._0_4_);
                            auVar166._4_4_ = auVar96._4_4_ * (auVar74._4_4_ + auVar74._4_4_);
                            auVar166._8_4_ = auVar96._8_4_ * (auVar74._8_4_ + auVar74._8_4_);
                            auVar166._12_4_ = auVar96._12_4_ * (auVar74._12_4_ + auVar74._12_4_);
                            auVar96 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar166,2);
                            auVar74 = vcmpps_avx(auVar166,*(undefined1 (*) [16])(ray + 0x80),2);
                            auVar96 = vandps_avx(auVar74,auVar96);
                            uVar49 = CONCAT44(auVar95._4_4_,auVar95._0_4_);
                            auVar201._0_8_ = uVar49 ^ 0x8000000080000000;
                            auVar201._8_4_ = -auVar95._8_4_;
                            auVar201._12_4_ = -auVar95._12_4_;
                            auVar74 = vcmpps_avx(auVar201,auVar95,4);
                            auVar96 = vandps_avx(auVar74,auVar96);
                            auVar96 = vpslld_avx(auVar96,0x1f);
                            auVar74 = vpsrad_avx(auVar96,0x1f);
                            auVar96 = auVar73 & auVar74;
                            auVar73 = vandps_avx(auVar74,auVar73);
                            if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar96 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || auVar96[0xf] < '\0') {
                              _local_18c8 = auVar157;
                              _local_18d8 = auVar169;
                              local_18e8 = auVar163;
                              local_18f8 = auVar166;
                              local_1908 = auVar18;
                              local_1918 = auVar202;
                              local_1928 = auVar153;
                            }
                          }
                          uVar10 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                          pGVar11 = (context->scene->geometries).items[uVar10].ptr;
                          uVar21 = pGVar11->mask;
                          auVar79._4_4_ = uVar21;
                          auVar79._0_4_ = uVar21;
                          auVar79._8_4_ = uVar21;
                          auVar79._12_4_ = uVar21;
                          auVar96 = vpand_avx(auVar79,*(undefined1 (*) [16])(ray + 0x90));
                          auVar96 = vpcmpeqd_avx(auVar96,_DAT_01f7aa10);
                          auVar153 = auVar73 & ~auVar96;
                          if ((((auVar153 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar153 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar153 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar153[0xf] < '\0') {
                            uVar53 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                            auVar96 = vandnps_avx(auVar96,auVar73);
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar73 = vandps_avx(auVar222,local_18e8);
                              auVar153 = vrcpps_avx(local_18e8);
                              auVar193._8_4_ = 0x3f800000;
                              auVar193._0_8_ = 0x3f8000003f800000;
                              auVar193._12_4_ = 0x3f800000;
                              auVar74 = vfnmadd213ps_fma(auVar153,local_18e8,auVar193);
                              auVar153 = vfmadd132ps_fma(auVar74,auVar153,auVar153);
                              auVar119._8_4_ = 0x219392ef;
                              auVar119._0_8_ = 0x219392ef219392ef;
                              auVar119._12_4_ = 0x219392ef;
                              auVar73 = vcmpps_avx(auVar73,auVar119,5);
                              auVar73 = vandps_avx(auVar73,auVar153);
                              auVar98._0_4_ = auVar73._0_4_ * (float)local_18c8._0_4_;
                              auVar98._4_4_ = auVar73._4_4_ * (float)local_18c8._4_4_;
                              auVar98._8_4_ = auVar73._8_4_ * fStack_18c0;
                              auVar98._12_4_ = auVar73._12_4_ * fStack_18bc;
                              auVar74 = vminps_avx(auVar98,auVar193);
                              auVar120._0_4_ = auVar73._0_4_ * (float)local_18d8._0_4_;
                              auVar120._4_4_ = auVar73._4_4_ * (float)local_18d8._4_4_;
                              auVar120._8_4_ = auVar73._8_4_ * fStack_18d0;
                              auVar120._12_4_ = auVar73._12_4_ * fStack_18cc;
                              auVar155 = vminps_avx(auVar120,auVar193);
                              uVar9 = *(undefined4 *)(pGVar44 + lVar56 + lVar33 + 0x2c);
                              auVar139._4_4_ = uVar9;
                              auVar139._0_4_ = uVar9;
                              auVar139._8_4_ = uVar9;
                              auVar139._12_4_ = uVar9;
                              auVar153 = vpsrld_avx(auVar139,0x10);
                              auVar202 = ZEXT816(0) << 0x40;
                              auVar73 = vpblendw_avx(auVar139,auVar202,0xaa);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar153 = vcvtdq2ps_avx(auVar153);
                              uVar9 = *(undefined4 *)(pGVar44 + lVar56 + lVar34 + 0x30);
                              auVar140._4_4_ = uVar9;
                              auVar140._0_4_ = uVar9;
                              auVar140._8_4_ = uVar9;
                              auVar140._12_4_ = uVar9;
                              uVar9 = *(undefined4 *)(pGVar44 + lVar56 + lVar33 + 0x30);
                              auVar181._4_4_ = uVar9;
                              auVar181._0_4_ = uVar9;
                              auVar181._8_4_ = uVar9;
                              auVar181._12_4_ = uVar9;
                              auVar214 = vsubps_avx(auVar193,auVar74);
                              auVar214 = vsubps_avx(auVar214,auVar155);
                              auVar168._0_4_ = auVar214._0_4_ * auVar73._0_4_ * 0.00012207031;
                              auVar168._4_4_ = auVar214._4_4_ * auVar73._4_4_ * 0.00012207031;
                              auVar168._8_4_ = auVar214._8_4_ * auVar73._8_4_ * 0.00012207031;
                              auVar168._12_4_ = auVar214._12_4_ * auVar73._12_4_ * 0.00012207031;
                              auVar154._0_4_ = auVar214._0_4_ * auVar153._0_4_ * 0.00012207031;
                              auVar154._4_4_ = auVar214._4_4_ * auVar153._4_4_ * 0.00012207031;
                              auVar154._8_4_ = auVar214._8_4_ * auVar153._8_4_ * 0.00012207031;
                              auVar154._12_4_ = auVar214._12_4_ * auVar153._12_4_ * 0.00012207031;
                              auVar73 = vpblendw_avx(auVar181,auVar202,0xaa);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar194._0_4_ = auVar73._0_4_ * 0.00012207031;
                              auVar194._4_4_ = auVar73._4_4_ * 0.00012207031;
                              auVar194._8_4_ = auVar73._8_4_ * 0.00012207031;
                              auVar194._12_4_ = auVar73._12_4_ * 0.00012207031;
                              auVar153 = vfmadd231ps_fma(auVar168,auVar155,auVar194);
                              auVar73 = vpsrld_avx(auVar181,0x10);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar182._0_4_ = auVar73._0_4_ * 0.00012207031;
                              auVar182._4_4_ = auVar73._4_4_ * 0.00012207031;
                              auVar182._8_4_ = auVar73._8_4_ * 0.00012207031;
                              auVar182._12_4_ = auVar73._12_4_ * 0.00012207031;
                              auVar155 = vfmadd231ps_fma(auVar154,auVar155,auVar182);
                              auVar73 = vpblendw_avx(auVar140,auVar202,0xaa);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar121._0_4_ = auVar73._0_4_ * 0.00012207031;
                              auVar121._4_4_ = auVar73._4_4_ * 0.00012207031;
                              auVar121._8_4_ = auVar73._8_4_ * 0.00012207031;
                              auVar121._12_4_ = auVar73._12_4_ * 0.00012207031;
                              local_19e8 = vfmadd231ps_fma(auVar153,auVar74,auVar121);
                              auVar73 = vpsrld_avx(auVar140,0x10);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar122._0_4_ = auVar73._0_4_ * 0.00012207031;
                              auVar122._4_4_ = auVar73._4_4_ * 0.00012207031;
                              auVar122._8_4_ = auVar73._8_4_ * 0.00012207031;
                              auVar122._12_4_ = auVar73._12_4_ * 0.00012207031;
                              local_19d8 = vfmadd231ps_fma(auVar155,auVar74,auVar122);
                              local_1a18 = local_1908._0_8_;
                              uStack_1a10 = local_1908._8_8_;
                              local_1a08 = local_1918._0_8_;
                              uStack_1a00 = local_1918._8_8_;
                              local_19f8 = local_1928._0_8_;
                              uStack_19f0 = local_1928._8_8_;
                              local_19b8._4_4_ = uVar10;
                              local_19b8._0_4_ = uVar10;
                              local_19b8._8_4_ = uVar10;
                              local_19b8._12_4_ = uVar10;
                              local_19c8._4_4_ = uVar53;
                              local_19c8._0_4_ = uVar53;
                              local_19c8._8_4_ = uVar53;
                              local_19c8._12_4_ = uVar53;
                              vpcmpeqd_avx2(ZEXT1632(local_19b8),ZEXT1632(local_19b8));
                              uStack_19a4 = context->user->instID[0];
                              local_19a8 = uStack_19a4;
                              uStack_19a0 = uStack_19a4;
                              uStack_199c = uStack_19a4;
                              uStack_1998 = context->user->instPrimID[0];
                              uStack_1994 = uStack_1998;
                              uStack_1990 = uStack_1998;
                              uStack_198c = uStack_1998;
                              auVar73 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar153 = vblendvps_avx(auVar73,local_18f8,auVar96);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar153;
                              args.valid = (int *)local_1c28;
                              args.geometryUserPtr = pGVar11->userPtr;
                              args.context = context->user;
                              args.hit = (RTCHitN *)&local_1a18;
                              args.N = 4;
                              local_1c28 = auVar96;
                              args.ray = (RTCRayN *)ray;
                              if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar11->occlusionFilterN)(&args);
                              }
                              if (local_1c28 == (undefined1  [16])0x0) {
                                auVar96 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                auVar96 = auVar96 ^ _DAT_01f7ae20;
                              }
                              else {
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var12)(&args);
                                }
                                auVar153 = vpcmpeqd_avx(local_1c28,_DAT_01f7aa10);
                                auVar96 = auVar153 ^ _DAT_01f7ae20;
                                auVar123._8_4_ = 0xff800000;
                                auVar123._0_8_ = 0xff800000ff800000;
                                auVar123._12_4_ = 0xff800000;
                                auVar153 = vblendvps_avx(auVar123,*(undefined1 (*) [16])
                                                                   (args.ray + 0x80),auVar153);
                                *(undefined1 (*) [16])(args.ray + 0x80) = auVar153;
                              }
                              auVar153 = vpslld_avx(auVar96,0x1f);
                              auVar96 = vpsrad_avx(auVar153,0x1f);
                              auVar73 = vblendvps_avx(auVar73,*(undefined1 (*) [16])local_1c10,
                                                      auVar153);
                              *(undefined1 (*) [16])local_1c10 = auVar73;
                            }
                            auVar83 = vpandn_avx(auVar96,auVar83);
                          }
                          auVar127 = ZEXT1664(auVar83);
                          lVar56 = lVar56 + 4;
                        } while ((((auVar83 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0 ||
                                  (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar83 >> 0x5f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) || auVar83[0xf] < '\0');
                        lVar62 = 1;
                        uVar51 = 0;
                      } while (((byte)local_1bfc & local_1c00 != 2) != 0);
                      auVar125._0_4_ = auVar141._0_4_ ^ local_1948._0_4_;
                      auVar125._4_4_ = auVar141._4_4_ ^ local_1948._4_4_;
                      auVar125._8_4_ = auVar141._8_4_ ^ local_1948._8_4_;
                      auVar125._12_4_ = auVar141._12_4_ ^ local_1948._12_4_;
                      auVar141 = vorps_avx(auVar127._0_16_,local_1958);
                      auVar103 = vandps_avx(auVar141,local_1938);
                      uVar47 = vmovmskps_avx(auVar125);
                      auVar141 = auVar125;
                    } while (uVar47 != 0);
                    aVar80._0_8_ = auVar103._0_8_ ^ 0xffffffffffffffff;
                    aVar80._8_4_ = auVar103._8_4_ ^ 0xffffffff;
                    aVar80._12_4_ = auVar103._12_4_ ^ 0xffffffff;
                    uVar57 = local_1c18;
                  }
                  sVar52 = 0;
                }
                else {
                  pre.super_Precalculations.grid = *(GridSOA **)(root.ptr & 0xfffffffffffffff0);
                  sVar52 = *(size_t *)pre.super_Precalculations.grid;
                  aVar80._8_8_ = uStack_1980;
                  aVar80._0_8_ = local_1988;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])aVar80,(undefined1  [16])terminated.field_0);
                auVar128 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar128 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar128 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar128 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar128[0xf]) goto LAB_019c90a8;
                auVar126._8_4_ = 0xff800000;
                auVar126._0_8_ = 0xff800000ff800000;
                auVar126._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar126,
                                   (undefined1  [16])terminated.field_0);
                if (sVar52 != 0) {
                  pNVar60->ptr = sVar52;
                  pNVar60 = pNVar60 + 1;
                  paVar61->i[0] = -0x800000;
                  paVar61->i[1] = -0x800000;
                  paVar61->i[2] = -0x800000;
                  paVar61->i[3] = -0x800000;
                  paVar61 = paVar61 + 1;
                }
              }
              goto LAB_019c77aa;
            }
            uVar49 = root.ptr & 0xfffffffffffffff0;
            lVar54 = -0x10;
            auVar128 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar127._0_16_,6);
            aVar81.i[2] = 0x7f800000;
            aVar81._0_8_ = 0x7f8000007f800000;
            aVar81.i[3] = 0x7f800000;
            sVar52 = 8;
            do {
              root.ptr = *(size_t *)(uVar49 + 0x20 + lVar54 * 2);
              if (root.ptr == 8) {
                auVar127 = ZEXT1664((undefined1  [16])aVar81);
                root.ptr = sVar52;
                break;
              }
              uVar53 = *(undefined4 *)(uVar49 + 0x90 + lVar54);
              auVar142._4_4_ = uVar53;
              auVar142._0_4_ = uVar53;
              auVar142._8_4_ = uVar53;
              auVar142._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar49 + 0x30 + lVar54);
              auVar73._4_4_ = uVar53;
              auVar73._0_4_ = uVar53;
              auVar73._8_4_ = uVar53;
              auVar73._12_4_ = uVar53;
              auVar101 = *(undefined1 (*) [16])(ray + 0x70);
              auVar141 = vfmadd231ps_fma(auVar73,auVar101,auVar142);
              uVar53 = *(undefined4 *)(uVar49 + 0xb0 + lVar54);
              auVar156._4_4_ = uVar53;
              auVar156._0_4_ = uVar53;
              auVar156._8_4_ = uVar53;
              auVar156._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar49 + 0x50 + lVar54);
              auVar143._4_4_ = uVar53;
              auVar143._0_4_ = uVar53;
              auVar143._8_4_ = uVar53;
              auVar143._12_4_ = uVar53;
              auVar96 = vfmadd231ps_fma(auVar143,auVar101,auVar156);
              uVar53 = *(undefined4 *)(uVar49 + 0xd0 + lVar54);
              auVar169._4_4_ = uVar53;
              auVar169._0_4_ = uVar53;
              auVar169._8_4_ = uVar53;
              auVar169._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar49 + 0x70 + lVar54);
              auVar157._4_4_ = uVar53;
              auVar157._0_4_ = uVar53;
              auVar157._8_4_ = uVar53;
              auVar157._12_4_ = uVar53;
              auVar73 = vfmadd231ps_fma(auVar157,auVar101,auVar169);
              uVar53 = *(undefined4 *)(uVar49 + 0xa0 + lVar54);
              auVar183._4_4_ = uVar53;
              auVar183._0_4_ = uVar53;
              auVar183._8_4_ = uVar53;
              auVar183._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar49 + 0x40 + lVar54);
              auVar170._4_4_ = uVar53;
              auVar170._0_4_ = uVar53;
              auVar170._8_4_ = uVar53;
              auVar170._12_4_ = uVar53;
              auVar153 = vfmadd231ps_fma(auVar170,auVar101,auVar183);
              uVar53 = *(undefined4 *)(uVar49 + 0xc0 + lVar54);
              auVar184._4_4_ = uVar53;
              auVar184._0_4_ = uVar53;
              auVar184._8_4_ = uVar53;
              auVar184._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar49 + 0x60 + lVar54);
              auVar195._4_4_ = uVar53;
              auVar195._0_4_ = uVar53;
              auVar195._8_4_ = uVar53;
              auVar195._12_4_ = uVar53;
              auVar74 = vfmadd231ps_fma(auVar195,auVar101,auVar184);
              uVar53 = *(undefined4 *)(uVar49 + 0xe0 + lVar54);
              auVar185._4_4_ = uVar53;
              auVar185._0_4_ = uVar53;
              auVar185._8_4_ = uVar53;
              auVar185._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar49 + 0x80 + lVar54);
              auVar203._4_4_ = uVar53;
              auVar203._0_4_ = uVar53;
              auVar203._8_4_ = uVar53;
              auVar203._12_4_ = uVar53;
              auVar83 = vfmadd231ps_fma(auVar203,auVar101,auVar185);
              auVar18._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar18._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar18._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar18._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar155 = vfmsub213ps_fma(auVar141,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar18);
              auVar19._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar19._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar19._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar19._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar214 = vfmsub213ps_fma(auVar96,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.y.field_0,auVar19);
              auVar20._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar20._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar20._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar20._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar202 = vfmsub213ps_fma(auVar73,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.z.field_0,auVar20);
              auVar73 = vfmsub213ps_fma(auVar153,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.x.field_0,auVar18);
              auVar153 = vfmsub213ps_fma(auVar74,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.y.field_0,auVar19);
              auVar74 = vfmsub213ps_fma(auVar83,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar20);
              auVar141 = vpminsd_avx(auVar155,auVar73);
              auVar96 = vpminsd_avx(auVar214,auVar153);
              auVar141 = vpmaxsd_avx(auVar141,auVar96);
              auVar96 = vpminsd_avx(auVar202,auVar74);
              auVar141 = vpmaxsd_avx(auVar141,auVar96);
              auVar96 = vpmaxsd_avx(auVar155,auVar73);
              auVar73 = vpmaxsd_avx(auVar214,auVar153);
              auVar153 = vpminsd_avx(auVar96,auVar73);
              auVar96 = vpmaxsd_avx(auVar202,auVar74);
              auVar73 = vpmaxsd_avx(auVar141,(undefined1  [16])tray.tnear.field_0);
              auVar96 = vpminsd_avx(auVar153,auVar96);
              auVar96 = vpminsd_avx(auVar96,(undefined1  [16])tray.tfar.field_0);
              if ((uVar47 & 7) == 6) {
                auVar96 = vcmpps_avx(auVar73,auVar96,2);
                uVar53 = *(undefined4 *)(uVar49 + 0xf0 + lVar54);
                auVar144._4_4_ = uVar53;
                auVar144._0_4_ = uVar53;
                auVar144._8_4_ = uVar53;
                auVar144._12_4_ = uVar53;
                auVar73 = vcmpps_avx(auVar144,auVar101,2);
                uVar53 = *(undefined4 *)(uVar49 + 0x100 + lVar54);
                auVar158._4_4_ = uVar53;
                auVar158._0_4_ = uVar53;
                auVar158._8_4_ = uVar53;
                auVar158._12_4_ = uVar53;
                auVar101 = vcmpps_avx(auVar101,auVar158,1);
                auVar101 = vandps_avx(auVar73,auVar101);
                auVar101 = vandps_avx(auVar101,auVar96);
              }
              else {
                auVar101 = vcmpps_avx(auVar73,auVar96,2);
              }
              auVar101 = vandps_avx(auVar101,auVar128);
              auVar101 = vpslld_avx(auVar101,0x1f);
              if ((((auVar101 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar101 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar101 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar101[0xf]) {
                auVar127 = ZEXT1664((undefined1  [16])aVar81);
                root.ptr = sVar52;
              }
              else {
                auVar129._8_4_ = 0x7f800000;
                auVar129._0_8_ = 0x7f8000007f800000;
                auVar129._12_4_ = 0x7f800000;
                auVar101 = vblendvps_avx(auVar129,auVar141,auVar101);
                auVar127 = ZEXT1664(auVar101);
                if (sVar52 != 8) {
                  pNVar60->ptr = sVar52;
                  pNVar60 = pNVar60 + 1;
                  *paVar61 = aVar81;
                  paVar61 = paVar61 + 1;
                }
              }
              aVar81 = auVar127._0_16_;
              lVar54 = lVar54 + 4;
              sVar52 = root.ptr;
            } while (lVar54 != 0);
            iVar48 = 4;
            if (root.ptr == 8) goto LAB_019c7a2c;
            auVar128 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                  (undefined1  [16])auVar127._0_16_,6);
            uVar53 = vmovmskps_avx(auVar128);
          } while (bVar22 < (byte)POPCOUNT(uVar53));
          pNVar60->ptr = root.ptr;
          pNVar60 = pNVar60 + 1;
          *paVar61 = auVar127._0_16_;
          paVar61 = paVar61 + 1;
        }
        else {
          do {
            sVar52 = 0;
            for (uVar57 = uVar63; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
              sVar52 = sVar52 + 1;
            }
            bVar46 = occluded1(This,bvh,root,sVar52,&pre,ray,&tray,context);
            if (bVar46) {
              terminated.field_0.i[sVar52] = -1;
            }
            uVar63 = uVar63 - 1 & uVar63;
          } while (uVar63 != 0);
          auVar128 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar128 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar128 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar128 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar128[0xf]) {
            iVar48 = 3;
          }
          else {
            auVar101._8_4_ = 0xff800000;
            auVar101._0_8_ = 0xff800000ff800000;
            auVar101._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar101,
                               (undefined1  [16])terminated.field_0);
            iVar48 = 2;
          }
          uVar57 = local_1c18;
          if (local_1c18 < uVar49) goto LAB_019c77eb;
        }
LAB_019c7a2c:
      } while ((iVar48 == 4) || (iVar48 == 2));
LAB_019c90a8:
      auVar128 = vandps_avx(local_1978,(undefined1  [16])terminated.field_0);
      auVar99._8_4_ = 0xff800000;
      auVar99._0_8_ = 0xff800000ff800000;
      auVar99._12_4_ = 0xff800000;
      auVar128 = vmaskmovps_avx(auVar128,auVar99);
      *(undefined1 (*) [16])local_1c10 = auVar128;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }